

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::integrateOutStatesAndScaleByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *integrationTmp,int *stateFrequenciesIndices
          ,int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int *piVar8;
  float *pfVar9;
  double *pdVar10;
  long lVar11;
  int k_1;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 in_XMM3_Qb;
  
  for (uVar14 = 0; uVar14 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar14 = uVar14 + 1
      ) {
    piVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
    iVar6 = piVar8[partitionIndices[uVar14]];
    lVar11 = (long)piVar8[(long)partitionIndices[uVar14] + 1];
    pfVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies
              [stateFrequenciesIndices[uVar14]];
    iVar7 = cumulativeScaleIndices[uVar14];
    fVar1 = pfVar13[1];
    fVar2 = *pfVar13;
    fVar3 = pfVar13[2];
    fVar4 = pfVar13[3];
    pfVar13 = integrationTmp + (long)(iVar6 * 4) + 3;
    lVar12 = (long)iVar6;
    for (lVar15 = lVar12; lVar15 < lVar11; lVar15 = lVar15 + 1) {
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar13[-2])),ZEXT416((uint)fVar2),
                                ZEXT416((uint)pfVar13[-3]));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar3),ZEXT416((uint)pfVar13[-1]));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar4),ZEXT416((uint)*pfVar13));
      dVar16 = log((double)auVar17._0_4_);
      pfVar13 = pfVar13 + 4;
      (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar15] = (float)dVar16;
    }
    if (iVar7 != -1) {
      pfVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
      pfVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[iVar7];
      for (lVar15 = lVar12; lVar15 < lVar11; lVar15 = lVar15 + 1) {
        pfVar13[lVar15] = pfVar9[lVar15] + pfVar13[lVar15];
      }
    }
    auVar17 = ZEXT816(0) << 0x40;
    outSumLogLikelihoodByPartition[uVar14] = 0.0;
    pdVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
    pfVar13 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    for (; lVar12 < lVar11; lVar12 = lVar12 + 1) {
      auVar18._0_8_ = (double)pfVar13[lVar12];
      auVar18._8_8_ = in_XMM3_Qb;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pdVar10[lVar12];
      auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar5);
      outSumLogLikelihoodByPartition[uVar14] = auVar17._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void inline BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::integrateOutStatesAndScaleByPartition(
                                                              const REALTYPE* integrationTmp,
                                                              const int* stateFrequenciesIndices,
                                                              const int* cumulativeScaleIndices,
                                                              const int* partitionIndices,
                                                              int partitionCount,
                                                              double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
      int pIndex = partitionIndices[p];
      int startPattern = gPatternPartitionsStartPatterns[pIndex];
      int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

      const int stateFrequenciesIndex = stateFrequenciesIndices[p];
      const int scalingFactorsIndex = cumulativeScaleIndices[p];

      REALTYPE freq0, freq1, freq2, freq3;
      freq0 = gStateFrequencies[stateFrequenciesIndex][0];
      freq1 = gStateFrequencies[stateFrequenciesIndex][1];
      freq2 = gStateFrequencies[stateFrequenciesIndex][2];
      freq3 = gStateFrequencies[stateFrequenciesIndex][3];

      int u = startPattern * 4;
      for(int k = startPattern; k < endPattern; k++) {
          REALTYPE sumOverI =
          freq0 * integrationTmp[u    ] +
          freq1 * integrationTmp[u + 1] +
          freq2 * integrationTmp[u + 2] +
          freq3 * integrationTmp[u + 3];

          u += 4;

          outLogLikelihoodsTmp[k] = log(sumOverI);
      }

      if (scalingFactorsIndex != BEAGLE_OP_NONE) {
          const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
          for(int k=startPattern; k < endPattern; k++) {
              outLogLikelihoodsTmp[k] += scalingFactors[k];
          }
      }

      outSumLogLikelihoodByPartition[p] = 0.0;
      for(int k=startPattern; k < endPattern; k++) {
          outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[k] * gPatternWeights[k];
      }
    }

}